

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters.c
# Opt level: O2

void ihevc_inter_pred_luma_vert_w16inp_w16out
               (WORD16 *pi2_src,WORD16 *pi2_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  short *psVar5;
  ulong uVar6;
  short *psVar7;
  long lVar8;
  short *psVar9;
  
  uVar6 = 0;
  uVar1 = (ulong)(uint)wd;
  if (wd < 1) {
    uVar1 = uVar6;
  }
  lVar2 = (long)src_strd;
  if (ht < 1) {
    ht = 0;
  }
  psVar7 = pi2_src + lVar2 * -3;
  for (; (int)uVar6 != ht; uVar6 = (ulong)((int)uVar6 + 1)) {
    psVar5 = psVar7;
    for (uVar3 = 0; uVar3 != uVar1; uVar3 = uVar3 + 1) {
      uVar4 = 0;
      psVar9 = psVar5;
      for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
        uVar4 = uVar4 + (int)*psVar9 * (int)pi1_coeff[lVar8];
        psVar9 = psVar9 + lVar2;
      }
      pi2_dst[uVar3] = (short)(uVar4 >> 6) + -0x2000;
      psVar5 = psVar5 + 1;
    }
    pi2_dst = pi2_dst + dst_strd;
    psVar7 = psVar7 + lVar2;
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_vert_w16inp_w16out(WORD16 *pi2_src,
                                              WORD16 *pi2_dst,
                                              WORD32 src_strd,
                                              WORD32 dst_strd,
                                              WORD8 *pi1_coeff,
                                              WORD32 ht,
                                              WORD32 wd)
{
    WORD32 row, col, i;
    WORD32 i4_tmp;

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            i4_tmp = 0;
            for(i = 0; i < NTAPS_LUMA; i++)
                i4_tmp += pi1_coeff[i] * pi2_src[col + (i - 3) * src_strd];

            i4_tmp = (i4_tmp >> SHIFT_14_MINUS_BIT_DEPTH) - OFFSET14;

            pi2_dst[col] = i4_tmp;
        }

        pi2_src += src_strd;
        pi2_dst += dst_strd;
    }

}